

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void __thiscall Player::~Player(Player *this)

{
  Logout(this);
  std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
            (&(this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>);
  std::__cxx11::string::~string((string *)&this->dutylast);
  std::__cxx11::string::~string((string *)&this->username);
  return;
}

Assistant:

Player::~Player()
{
	this->Logout();
}